

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v7::detail::
       parse_arg_id<char,fmt::v7::detail::width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>>&,char>>
                 (char *begin,char *end,
                 width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>_&,_char>
                 *handler)

{
  byte bVar1;
  char cVar2;
  basic_format_parse_context<char,_fmt::v7::detail::error_handler> *pbVar3;
  basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *pbVar4;
  int iVar5;
  uint id;
  byte *pbVar6;
  byte *pbVar7;
  char *pcVar8;
  char *pcVar9;
  format_arg *__return_storage_ptr__;
  byte *pbVar10;
  specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>
  *psVar11;
  basic_string_view<char> name;
  format_arg arg;
  format_arg local_48;
  
  if (begin == end) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/include/fmt/format.h"
                ,0xa8e,"");
  }
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    psVar11 = handler->handler;
    pbVar3 = (psVar11->
             super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
             ).parse_context_;
    id = pbVar3->next_arg_id_;
    if ((int)id < 0) {
      error_handler::on_error
                ((error_handler *)begin,"cannot switch from manual to automatic argument indexing");
    }
    pbVar4 = (psVar11->
             super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
             ).context_;
    pbVar3->next_arg_id_ = id + 1;
    pcVar8 = begin;
  }
  else {
    if (9 < (byte)(bVar1 - 0x30)) {
      if ((bVar1 != 0x5f) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) goto LAB_00398f85;
      pbVar7 = (byte *)(begin + 1);
      do {
        pbVar6 = pbVar7;
        pbVar10 = (byte *)end;
        if (pbVar6 == (byte *)end) break;
        bVar1 = *pbVar6;
        pbVar7 = pbVar6 + 1;
      } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
              (pbVar10 = pbVar6, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
      name.size_ = (long)pbVar10 - (long)begin;
      if ((long)name.size_ < 0) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/include/fmt/core.h"
                    ,0x146,"negative value");
      }
      psVar11 = handler->handler;
      __return_storage_ptr__ = &local_48;
      name.data_ = begin;
      basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
      ::get<char>(__return_storage_ptr__,
                  &((psVar11->
                    super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                    ).context_)->args_,name);
      if (local_48.type_ != none_type) {
        iVar5 = get_dynamic_spec<fmt::v7::detail::width_checker,fmt::v7::basic_format_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>,fmt::v7::detail::error_handler>
                          ();
        ((psVar11->
         super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
         ).super_specs_setter<char>.specs_)->width = iVar5;
        return (char *)pbVar10;
      }
      goto LAB_00398f6d;
    }
    pcVar8 = begin + 1;
    if (bVar1 == 0x30) {
      id = 0;
    }
    else {
      id = 0;
      pcVar9 = pcVar8;
      while (id < 0xccccccd) {
        id = ((int)pcVar9[-1] + id * 10) - 0x30;
        pcVar8 = end;
        if ((pcVar9 == end) ||
           (cVar2 = *pcVar9, pcVar8 = pcVar9, pcVar9 = pcVar9 + 1, 9 < (byte)(cVar2 - 0x30U)))
        goto LAB_00398f10;
      }
      id = 0x80000000;
      pcVar8 = pcVar9 + -1;
LAB_00398f10:
      if ((int)id < 0) {
        error_handler::on_error((error_handler *)begin,"number is too big");
      }
    }
    if ((pcVar8 == end) || ((*pcVar8 != ':' && (*pcVar8 != '}')))) {
LAB_00398f85:
      error_handler::on_error((error_handler *)begin,"invalid format string");
    }
    psVar11 = handler->handler;
    pbVar3 = (psVar11->
             super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
             ).parse_context_;
    if (0 < pbVar3->next_arg_id_) {
      error_handler::on_error
                ((error_handler *)begin,"cannot switch from automatic to manual argument indexing");
    }
    pbVar3->next_arg_id_ = -1;
    pbVar4 = (psVar11->
             super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
             ).context_;
  }
  __return_storage_ptr__ = &local_48;
  basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  ::get(__return_storage_ptr__,&pbVar4->args_,id);
  if (local_48.type_ != none_type) {
    iVar5 = get_dynamic_spec<fmt::v7::detail::width_checker,fmt::v7::basic_format_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>,fmt::v7::detail::error_handler>
                      ();
    ((psVar11->
     super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
     ).super_specs_setter<char>.specs_)->width = iVar5;
    return pcVar8;
  }
LAB_00398f6d:
  error_handler::on_error((error_handler *)__return_storage_ptr__,"argument not found");
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = 0;
    if (c != '0')
      index = parse_nonnegative_int(begin, end, handler);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}